

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O0

Result * CoreML::validateModelLevelFeatureDescriptionsAreEmpty
                   (Result *__return_storage_ptr__,ModelDescription *interface)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *this;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  ModelDescription *local_18;
  ModelDescription *interface_local;
  
  local_18 = interface;
  interface_local = (ModelDescription *)__return_storage_ptr__;
  iVar2 = Specification::ModelDescription::input_size(interface);
  if (iVar2 == 0) {
    iVar2 = Specification::ModelDescription::output_size(local_18);
    if (iVar2 == 0) {
      iVar2 = Specification::ModelDescription::state_size(local_18);
      if (iVar2 == 0) {
        Specification::ModelDescription::predictedfeaturename_abi_cxx11_(local_18);
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c0,
                     "Multi-function model must not use top level predictedFeatureName field.",
                     &local_c1);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
          std::allocator<char>::~allocator(&local_c1);
        }
        else {
          Specification::ModelDescription::predictedprobabilitiesname_abi_cxx11_(local_18);
          uVar3 = std::__cxx11::string::empty();
          if ((uVar3 & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_e8,
                       "Multi-function model must not use top level predictedProbabilitiesName field."
                       ,&local_e9);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_e8);
            std::__cxx11::string::~string((string *)&local_e8);
            std::allocator<char>::~allocator(&local_e9);
          }
          else {
            this = Specification::ModelDescription::traininginput(local_18);
            bVar1 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
                    empty(this);
            if (bVar1) {
              Result::Result(__return_storage_ptr__);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_110,
                         "Multi-function model must not use top level training input feature description."
                         ,&local_111);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_110);
              std::__cxx11::string::~string((string *)&local_110);
              std::allocator<char>::~allocator(&local_111);
            }
          }
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,
                   "Multi-function model must not use top level state feature description.",
                   &local_99);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::allocator<char>::~allocator(&local_99);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,
                 "Multi-function model must not use top level output feature description.",&local_71
                );
      Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator(&local_71);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,
               "Multi-function model must not use top level input feature description.",&local_39);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateModelLevelFeatureDescriptionsAreEmpty(const Specification::ModelDescription& interface) {
        if (interface.input_size() != 0) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, "Multi-function model must not use top level input feature description.");
        }

        if (interface.output_size() != 0) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, "Multi-function model must not use top level output feature description.");
        }

        if (interface.state_size() != 0) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, "Multi-function model must not use top level state feature description.");
        }

        if (!interface.predictedfeaturename().empty()) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, "Multi-function model must not use top level predictedFeatureName field.");
        }

        if (!interface.predictedprobabilitiesname().empty()) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, "Multi-function model must not use top level predictedProbabilitiesName field.");
        }

        if (!interface.traininginput().empty()) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, "Multi-function model must not use top level training input feature description.");
        }

        return Result();
    }